

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cordz_info.cc
# Opt level: O0

void __thiscall absl::lts_20250127::cord_internal::CordzInfo::Track(CordzInfo *this)

{
  __pointer_type __p;
  CordzInfo *head;
  SpinLockHolder l;
  CordzInfo *this_local;
  
  l.lock_ = (SpinLock *)this;
  base_internal::SpinLockHolder::SpinLockHolder((SpinLockHolder *)&head,&this->list_->mutex);
  __p = std::atomic<absl::lts_20250127::cord_internal::CordzInfo_*>::load
                  (&this->list_->head,memory_order_acquire);
  if (__p != (__pointer_type)0x0) {
    std::atomic<absl::lts_20250127::cord_internal::CordzInfo_*>::store
              (&__p->ci_prev_,this,memory_order_release);
  }
  std::atomic<absl::lts_20250127::cord_internal::CordzInfo_*>::store
            (&this->ci_next_,__p,memory_order_release);
  std::atomic<absl::lts_20250127::cord_internal::CordzInfo_*>::store
            (&this->list_->head,this,memory_order_release);
  base_internal::SpinLockHolder::~SpinLockHolder((SpinLockHolder *)&head);
  return;
}

Assistant:

void CordzInfo::Track() {
  SpinLockHolder l(&list_->mutex);

  CordzInfo* const head = list_->head.load(std::memory_order_acquire);
  if (head != nullptr) {
    head->ci_prev_.store(this, std::memory_order_release);
  }
  ci_next_.store(head, std::memory_order_release);
  list_->head.store(this, std::memory_order_release);
}